

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O2

void __thiscall QRingBuffer::free(QRingBuffer *this,void *__ptr)

{
  QRingChunk *pQVar1;
  Data *pDVar2;
  long lVar3;
  iterator iVar4;
  
  while( true ) {
    if ((long)__ptr < 1) {
      return;
    }
    if ((this->buffers).d.size == 1) break;
    pQVar1 = (this->buffers).d.ptr;
    lVar3 = pQVar1->tailOffset - pQVar1->headOffset;
    if ((long)__ptr < lVar3) break;
    this->bufferSize = this->bufferSize - lVar3;
    QList<QRingChunk>::removeFirst(&this->buffers);
    __ptr = (void *)((long)__ptr - lVar3);
  }
  iVar4 = QList<QRingChunk>::begin(&this->buffers);
  lVar3 = this->bufferSize - (long)__ptr;
  if (lVar3 != 0) {
    (iVar4.i)->headOffset = (iVar4.i)->headOffset + (long)__ptr;
    this->bufferSize = lVar3;
    return;
  }
  if (((((iVar4.i)->chunk).d.size <= (long)this->basicBlockSize) &&
      (pDVar2 = ((iVar4.i)->chunk).d.d, pDVar2 != (Data *)0x0)) &&
     ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 1))
  {
    (iVar4.i)->headOffset = 0;
    (iVar4.i)->tailOffset = 0;
    this->bufferSize = 0;
    return;
  }
  clear(this);
  return;
}

Assistant:

void QRingBuffer::free(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qint64 chunkSize = buffers.constFirst().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.first();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.advance(bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeFirst();
    }
}